

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_kfold_strto(jit_State *J)

{
  int iVar1;
  TRef TVar2;
  TValue tv;
  TValue n;
  
  iVar1 = lj_strscan_num((GCstr *)(ulong)(J->fold).left.field_1.op12,&n);
  if (iVar1 != 0) {
    TVar2 = lj_ir_knum_u64(J,n.u64);
    return TVar2;
  }
  return 3;
}

Assistant:

LJFOLD(STRTO KGC)
LJFOLDF(kfold_strto)
{
  TValue n;
  if (lj_strscan_num(ir_kstr(fleft), &n))
    return lj_ir_knum(J, numV(&n));
  return FAILFOLD;
}